

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::BinaryOp<7,_(rsg::Associativity)0>::~BinaryOp(BinaryOp<7,_(rsg::Associativity)0> *this)

{
  BinaryOp<7,_(rsg::Associativity)0> *this_local;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__BinaryOp_032ebf18;
  if (this->m_leftValueExpr != (Expression *)0x0) {
    (*this->m_leftValueExpr->_vptr_Expression[1])();
  }
  if (this->m_rightValueExpr != (Expression *)0x0) {
    (*this->m_rightValueExpr->_vptr_Expression[1])();
  }
  ValueRange::~ValueRange(&this->m_rightValueRange);
  ValueRange::~ValueRange(&this->m_leftValueRange);
  ValueStorage<64>::~ValueStorage(&this->m_value);
  VariableType::~VariableType(&this->m_type);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

BinaryOp<Precedence, Assoc>::~BinaryOp (void)
{
	delete m_leftValueExpr;
	delete m_rightValueExpr;
}